

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::Own<kj::AsyncCapabilityStream>_> __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1823:13),_kj::_::PropagateException>
::anon_class_1_0_00000001_for_func::operator()
          (anon_class_1_0_00000001_for_func *this,Maybe<kj::Own<kj::AsyncCapabilityStream>_> *result
          )

{
  char (*in_RCX) [41];
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  Promise<kj::Own<kj::AsyncCapabilityStream>_> PVar2;
  FixVoid<kj::Own<kj::AsyncCapabilityStream>_> local_198;
  Array<char> local_188;
  Exception local_170;
  
  local_198.ptr = (AsyncCapabilityStream *)in_RDX[1];
  if (local_198.ptr == (AsyncCapabilityStream *)0x0) {
    Debug::makeDescription<char_const(&)[41]>
              ((String *)&local_188,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_170,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x724,(String *)&local_188);
    Promise<kj::Own<kj::AsyncCapabilityStream>_>::Promise
              ((Promise<kj::Own<kj::AsyncCapabilityStream>_> *)this,&local_170);
    Exception::~Exception(&local_170);
    Array<char>::~Array(&local_188);
    pPVar1 = extraout_RDX_00;
  }
  else {
    local_198.disposer = (Disposer *)*in_RDX;
    in_RDX[1] = 0;
    Promise<kj::Own<kj::AsyncCapabilityStream>_>::Promise
              ((Promise<kj::Own<kj::AsyncCapabilityStream>_> *)this,&local_198);
    Own<kj::AsyncCapabilityStream>::dispose(&local_198);
    pPVar1 = extraout_RDX;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::AsyncCapabilityStream>_>)PVar2.super_PromiseBase.node;
}

Assistant:

KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    }